

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng.c
# Opt level: O2

char * light_pcapng_to_string(light_pcapng pcapng)

{
  uint32_t uVar1;
  char *pcVar2;
  char *__s;
  light_pcapng p_Var3;
  size_t __n;
  ulong uVar4;
  char *__dest;
  
  if (pcapng == (light_pcapng)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    uVar1 = light_get_block_count(pcapng);
    pcVar2 = (char *)calloc((ulong)(uVar1 << 7),1);
    __dest = pcVar2;
    if (pcVar2 == (char *)0x0) {
      pcVar2 = (char *)0x0;
      fprintf(_stderr,"NULL pointer ERROR at %s::%s::%d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/rvelea[P]LightPcapNg/src/light_pcapng.c"
              ,"light_pcapng_to_string",0x13e);
    }
    else {
      for (; pcapng != (light_pcapng)0x0; pcapng = pcapng->next_block) {
        __s = (char *)calloc(0x80,1);
        uVar4 = 0xffffffff;
        p_Var3 = pcapng;
        do {
          p_Var3 = (light_pcapng)p_Var3->options;
          uVar4 = (ulong)((int)uVar4 + 1);
        } while (p_Var3 != (light_pcapng)0x0);
        sprintf(__s,"---\nType = 0x%X\nLength = %u\nData Pointer = %p\nOption count = %d\n---\n",
                (ulong)pcapng->block_type,(ulong)pcapng->block_total_lenght,pcapng->block_body,uVar4
               );
        __n = strlen(__s);
        memcpy(__dest,__s,__n);
        free(__s);
        __dest = __dest + __n;
      }
    }
  }
  return pcVar2;
}

Assistant:

char *light_pcapng_to_string(light_pcapng pcapng)
{
	if (pcapng == NULL)
		return NULL;

	light_pcapng iter = pcapng;
	uint32_t block_count = light_get_block_count(pcapng);
	size_t buffer_size = 128 * block_count;
	char *string = calloc(buffer_size, sizeof(char));
	char *offset = string;
	DCHECK_NULLP(offset, return NULL);

	while (iter != NULL) {
		char *next = calloc(128, 1);

		sprintf(next, "---\nType = 0x%X\nLength = %u\nData Pointer = %p\nOption count = %d\n---\n",
				iter->block_type, iter->block_total_lenght, (void*)iter->block_body, __option_count(iter->options));

		memcpy(offset, next, strlen(next));
		offset += strlen(next);
		free(next);
		iter = iter->next_block;
	}

	return string;
}